

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

void extra_close_record(ctl_extr_rec *ctl,int ce_size)

{
  long lVar1;
  int iVar2;
  
  if (0 < ce_size) {
    extra_tell_used_size(ctl,ce_size);
  }
  iVar2 = 0;
  if (((long)ctl->cur_len & 1U) != 0) {
    lVar1 = (long)ctl->cur_len + 1;
    ctl->cur_len = (int)lVar1;
    iVar2 = -1;
    if (ctl->bp != (uchar *)0x0) {
      ctl->bp[lVar1] = '\0';
    }
  }
  if (ctl->use_extr == 0) {
    ctl->dr_len = ctl->cur_len;
  }
  else if (ctl->ce_ptr != (uchar *)0x0) {
    set_SUSP_CE(ctl->ce_ptr,ctl->extr_loc,ctl->extr_off,iVar2 + ctl->cur_len);
    return;
  }
  return;
}

Assistant:

static void
extra_close_record(struct ctl_extr_rec *ctl, int ce_size)
{
	int padding = 0;

	if (ce_size > 0)
		extra_tell_used_size(ctl, ce_size);
	/* Padding. */
	if (ctl->cur_len & 0x01) {
		ctl->cur_len++;
		if (ctl->bp != NULL)
			ctl->bp[ctl->cur_len] = 0;
		padding = 1;
	}
	if (ctl->use_extr) {
		if (ctl->ce_ptr != NULL)
			set_SUSP_CE(ctl->ce_ptr, ctl->extr_loc,
			    ctl->extr_off, ctl->cur_len - padding);
	} else
		ctl->dr_len = ctl->cur_len;
}